

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexDataUV
          (MeshGeometry *this,vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *uv_out
          ,Scope *source,string *MappingInformationType,string *ReferenceInformationType)

{
  size_type vertex_count;
  string *ReferenceInformationType_local;
  string *MappingInformationType_local;
  Scope *source_local;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *uv_out_local;
  MeshGeometry *this_local;
  
  vertex_count = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           (&this->m_vertices);
  ResolveVertexDataArray<aiVector2t<float>>
            (uv_out,source,MappingInformationType,ReferenceInformationType,"UV","UVIndex",
             vertex_count,&this->m_mapping_counts,&this->m_mapping_offsets,&this->m_mappings);
  return;
}

Assistant:

void MeshGeometry::ReadVertexDataUV(std::vector<aiVector2D>& uv_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType)
{
    ResolveVertexDataArray(uv_out,source,MappingInformationType,ReferenceInformationType,
        "UV",
        "UVIndex",
        m_vertices.size(),
        m_mapping_counts,
        m_mapping_offsets,
        m_mappings);
}